

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ClassDeclarationSyntax::setChild
          (ClassDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  logic_error *this_00;
  Token TVar4;
  NamedBlockClauseSyntax *local_190;
  ImplementsClauseSyntax *local_188;
  ExtendsClauseSyntax *local_180;
  ParameterPortListSyntax *local_178;
  string local_150;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  Info *local_70;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  ClassDeclarationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar3);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->virtualOrInterface).kind = (undefined2)local_28;
    (this->virtualOrInterface).field_0x2 = local_28._2_1_;
    (this->virtualOrInterface).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->virtualOrInterface).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->virtualOrInterface).info = local_20;
    break;
  case 2:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->classKeyword).kind = (undefined2)local_38;
    (this->classKeyword).field_0x2 = local_38._2_1_;
    (this->classKeyword).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->classKeyword).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->classKeyword).info = local_30;
    break;
  case 3:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar4._0_8_;
    (this->lifetime).kind = (undefined2)local_48;
    (this->lifetime).field_0x2 = local_48._2_1_;
    (this->lifetime).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->lifetime).rawLen = local_48._4_4_;
    local_40 = TVar4.info;
    (this->lifetime).info = local_40;
    break;
  case 4:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar4._0_8_;
    (this->name).kind = (undefined2)local_58;
    (this->name).field_0x2 = local_58._2_1_;
    (this->name).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->name).rawLen = local_58._4_4_;
    local_50 = TVar4.info;
    (this->name).info = local_50;
    break;
  case 5:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_178 = (ParameterPortListSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::ParameterPortListSyntax>(pSVar3);
    }
    this->parameters = local_178;
    break;
  case 6:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_180 = (ExtendsClauseSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_180 = SyntaxNode::as<slang::syntax::ExtendsClauseSyntax>(pSVar3);
    }
    this->extendsClause = local_180;
    break;
  case 7:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_188 = (ImplementsClauseSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_188 = SyntaxNode::as<slang::syntax::ImplementsClauseSyntax>(pSVar3);
    }
    this->implementsClause = local_188;
    break;
  case 8:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar4._0_8_;
    (this->semi).kind = (undefined2)local_68;
    (this->semi).field_0x2 = local_68._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->semi).rawLen = local_68._4_4_;
    local_60 = TVar4.info;
    (this->semi).info = local_60;
    break;
  case 9:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar3);
    SyntaxList<slang::syntax::MemberSyntax>::operator=(&this->items,pSVar2);
    break;
  case 10:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_78 = TVar4._0_8_;
    (this->endClass).kind = (undefined2)local_78;
    (this->endClass).field_0x2 = local_78._2_1_;
    (this->endClass).numFlags = (NumericTokenFlags)local_78._3_1_;
    (this->endClass).rawLen = local_78._4_4_;
    local_70 = TVar4.info;
    (this->endClass).info = local_70;
    break;
  case 0xb:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_190 = (NamedBlockClauseSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_190 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar3);
    }
    this->endBlockName = local_190;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_119);
    std::operator+(&local_f8,&local_118,":");
    std::__cxx11::to_string(&local_150,0x7dc);
    std::operator+(&local_d8,&local_f8,&local_150);
    std::operator+(&local_b8,&local_d8,": ");
    std::operator+(&local_98,&local_b8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void ClassDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: virtualOrInterface = child.token(); return;
        case 2: classKeyword = child.token(); return;
        case 3: lifetime = child.token(); return;
        case 4: name = child.token(); return;
        case 5: parameters = child.node() ? &child.node()->as<ParameterPortListSyntax>() : nullptr; return;
        case 6: extendsClause = child.node() ? &child.node()->as<ExtendsClauseSyntax>() : nullptr; return;
        case 7: implementsClause = child.node() ? &child.node()->as<ImplementsClauseSyntax>() : nullptr; return;
        case 8: semi = child.token(); return;
        case 9: items = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 10: endClass = child.token(); return;
        case 11: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}